

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint16_t __thiscall icu_63::Normalizer2Impl::getRawNorm16(Normalizer2Impl *this,UChar32 c)

{
  UCPTrie *trie;
  void *pvVar1;
  int32_t iVar2;
  
  trie = this->normTrie;
  pvVar1 = (trie->data).ptr0;
  if ((uint)c < 0x10000) {
    iVar2 = (c & 0x3fU) + (uint)trie->index[(uint)c >> 6];
  }
  else if ((uint)c < 0x110000) {
    if (c < trie->highStart) {
      iVar2 = ucptrie_internalSmallIndex_63(trie,c);
    }
    else {
      iVar2 = trie->dataLength + -2;
    }
  }
  else {
    iVar2 = trie->dataLength + -1;
  }
  return *(uint16_t *)((long)pvVar1 + (long)iVar2 * 2);
}

Assistant:

uint16_t getRawNorm16(UChar32 c) const { return UCPTRIE_FAST_GET(normTrie, UCPTRIE_16, c); }